

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test *this)

{
  iuStreamMessage *piVar1;
  int x;
  iuCodeMessage local_378;
  ScopedMessage scoped_message_2;
  iuStreamMessage local_318;
  iuStreamMessage local_190;
  
  x = 100;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_318.m_stream);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_318,(char (*) [13])"routine1. x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<(piVar1,&x);
  iutest::detail::iuStreamMessage::operator<<(&local_190,piVar1);
  std::__cxx11::stringbuf::str();
  local_378.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  local_378.m_line = 0x7c;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage(&scoped_message_2,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_318.m_stream);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  Sub1(x);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&scoped_message_2);
  Sub1(3);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine1)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "routine1. x=" << x);

        Sub1(x);
    }
    // ここの失敗には "routine1." のメッセージは表示されません。
    Sub1(3);
}